

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cpp
# Opt level: O2

int __thiscall
ncnn::RNN::forward(RNN *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  int iVar1;
  Mat *bottom_blob;
  Allocator *_allocator;
  Mat *this_00;
  pointer pMVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  void *__src;
  void *__dest;
  uint reverse;
  bool bVar6;
  Mat top_blob_forward;
  Mat hidden;
  Mat top_blob_reverse;
  Mat local_198;
  Mat local_150;
  Mat hidden1;
  Mat hidden0;
  Mat local_78;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  _h = bottom_blob->h;
  iVar1 = this->direction;
  hidden.cstep = 0;
  hidden.data = (void *)0x0;
  hidden.refcount._0_4_ = 0;
  hidden.refcount._4_4_ = 0;
  hidden.elemsize._0_4_ = 0;
  hidden._20_8_ = 0;
  hidden.allocator = (Allocator *)0x0;
  hidden.dims = 0;
  hidden.w = 0;
  hidden.h = 0;
  hidden.d = 0;
  hidden.c = 0;
  _allocator = (&opt->blob_allocator)
               [(long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start != 0x90];
  iVar3 = -100;
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)bottom_blob == 0x90) {
    Mat::clone(&top_blob_forward,(__fn *)(bottom_blob + 1),_allocator,0x90,_allocator);
    Mat::operator=(&hidden,&top_blob_forward);
    Mat::~Mat(&top_blob_forward);
  }
  else {
    Mat::create(&hidden,this->num_output,(iVar1 == 2) + 1,4,_allocator);
    if ((hidden.data == (void *)0x0) || ((long)hidden.c * hidden.cstep == 0)) goto LAB_001f9f5f;
    Mat::fill(&hidden,0.0);
  }
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->num_output << (iVar1 == 2),_h,4,opt->blob_allocator);
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    reverse = this->direction;
    if (reverse < 2) {
      Mat::channel(&top_blob_forward,&this->weight_xc_data,0);
      Mat::channel(&top_blob_reverse,&this->bias_c_data,0);
      Mat::channel(&hidden0,&this->weight_hc_data,0);
      iVar3 = rnn(bottom_blob,this_00,reverse,&top_blob_forward,&top_blob_reverse,&hidden0,&hidden,
                  opt);
      Mat::~Mat(&hidden0);
      Mat::~Mat(&top_blob_reverse);
      Mat::~Mat(&top_blob_forward);
      if (iVar3 != 0) goto LAB_001f9f5f;
      reverse = this->direction;
    }
    if (reverse == 2) {
      Mat::Mat(&top_blob_forward,this->num_output,_h,4,opt->workspace_allocator);
      iVar3 = -100;
      if ((top_blob_forward.data == (void *)0x0) ||
         ((long)top_blob_forward.c * top_blob_forward.cstep == 0)) {
        bVar6 = false;
      }
      else {
        Mat::Mat(&top_blob_reverse,this->num_output,_h,4,opt->workspace_allocator);
        iVar3 = -100;
        if ((top_blob_reverse.data == (void *)0x0) ||
           ((long)top_blob_reverse.c * top_blob_reverse.cstep == 0)) {
          bVar6 = false;
        }
        else {
          Mat::row_range(&hidden0,&hidden,0,1);
          Mat::channel(&hidden1,&this->weight_xc_data,0);
          Mat::channel(&local_150,&this->bias_c_data,0);
          Mat::channel(&local_198,&this->weight_hc_data,0);
          iVar3 = rnn(bottom_blob,&top_blob_forward,0,&hidden1,&local_150,&local_198,&hidden0,opt);
          Mat::~Mat(&local_198);
          Mat::~Mat(&local_150);
          Mat::~Mat(&hidden1);
          if (iVar3 == 0) {
            Mat::row_range(&hidden1,&hidden,1,1);
            Mat::channel(&local_150,&this->weight_xc_data,1);
            Mat::channel(&local_198,&this->bias_c_data,1);
            Mat::channel(&local_78,&this->weight_hc_data,1);
            iVar3 = rnn(bottom_blob,&top_blob_reverse,1,&local_150,&local_198,&local_78,&hidden1,opt
                       );
            Mat::~Mat(&local_78);
            Mat::~Mat(&local_198);
            Mat::~Mat(&local_150);
            bVar6 = iVar3 == 0;
            if (bVar6) {
              iVar3 = 0;
              uVar4 = (ulong)_h;
              if ((int)_h < 1) {
                uVar4 = 0;
              }
              for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
                __src = (void *)((long)top_blob_reverse.w * uVar5 * top_blob_reverse.elemsize +
                                (long)top_blob_reverse.data);
                __dest = (void *)((long)this_00->w * uVar5 * this_00->elemsize + (long)this_00->data
                                 );
                memcpy(__dest,(void *)((long)top_blob_forward.w * uVar5 * top_blob_forward.elemsize
                                      + (long)top_blob_forward.data),(long)this->num_output << 2);
                memcpy((void *)((long)this->num_output * 4 + (long)__dest),__src,
                       (long)this->num_output << 2);
              }
            }
            Mat::~Mat(&hidden1);
          }
          else {
            bVar6 = false;
          }
          Mat::~Mat(&hidden0);
        }
        Mat::~Mat(&top_blob_reverse);
      }
      Mat::~Mat(&top_blob_forward);
      if (!bVar6) goto LAB_001f9f5f;
    }
    pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar3 = 0;
    if ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pMVar2 == 0x90) {
      Mat::operator=(pMVar2 + 1,&hidden);
    }
  }
LAB_001f9f5f:
  Mat::~Mat(&hidden);
  return iVar3;
}

Assistant:

int RNN::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Allocator* hidden_allocator = top_blobs.size() == 2 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 2)
    {
        hidden = bottom_blobs[1].clone(hidden_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = rnn(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        int ret0 = rnn(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden0, opt);
        if (ret0 != 0)
            return ret0;

        Mat hidden1 = hidden.row_range(1, 1);
        int ret1 = rnn(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden1, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 2)
    {
        top_blobs[1] = hidden;
    }

    return 0;
}